

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O0

void * cluster_worker(void *data)

{
  MppThread *this;
  MppThreadStatus MVar1;
  Mutex *mutex;
  int local_3c;
  undefined1 local_38 [8];
  AutoMutex autolock;
  RK_S32 task_count;
  MppThread *thd;
  ClusterWorker *p;
  void *data_local;
  
  this = *(MppThread **)((long)data + 0x30);
  while( true ) {
    autolock.mLock._4_4_ = 0;
    if ((mpp_cluster_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s lock start\n",(char *)0x0,data);
    }
    mutex = MppThread::mutex(this,THREAD_WORK);
    Mutex::Autolock::Autolock((Autolock *)local_38,mutex,1);
    if ((mpp_cluster_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s lock done\n",(char *)0x0,data);
    }
    MVar1 = MppThread::get_status(this,THREAD_WORK);
    if (MVar1 == MPP_THREAD_RUNNING) {
      autolock.mLock._4_4_ = cluster_worker_get_task((ClusterWorker *)data);
      if (autolock.mLock._4_4_ == 0) {
        *(undefined4 *)((long)data + 0x38) = 0;
        MppThread::wait(this,(void *)0x0);
        *(undefined4 *)((long)data + 0x38) = 1;
      }
      local_3c = 0;
    }
    else {
      local_3c = 3;
    }
    Mutex::Autolock::~Autolock((Autolock *)local_38);
    if (local_3c != 0) break;
    cluster_worker_run_task((ClusterWorker *)data);
  }
  return (void *)0x0;
}

Assistant:

static void *cluster_worker(void *data)
{
    ClusterWorker *p = (ClusterWorker *)data;
    MppThread *thd = p->thd;

    while (1) {
        {
            RK_S32 task_count = 0;

            cluster_dbg_lock("%s lock start\n", p->name);
            AutoMutex autolock(thd->mutex());
            cluster_dbg_lock("%s lock done\n", p->name);

            if (MPP_THREAD_RUNNING != thd->get_status())
                break;

            task_count = cluster_worker_get_task(p);
            if (!task_count) {
                p->state = WORKER_IDLE;
                thd->wait();
                p->state = WORKER_RUNNING;
            }
        }

        cluster_worker_run_task(p);
    }

    return NULL;
}